

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O3

StringRef __thiscall
mp::internal::TextReader<fmt::Locale>::ReadString(TextReader<fmt::Locale> *this)

{
  int iVar1;
  char *loc;
  int iVar2;
  char *pcVar3;
  StringRef SVar4;
  ArgList local_40;
  
  iVar1 = ReadUInt<int>(this);
  pcVar3 = (this->super_ReaderBase).ptr_;
  if (*pcVar3 != ':') {
    local_40.types_ = 0;
    DoReportError(this,pcVar3,(CStringRef)0x13a764,&local_40);
    pcVar3 = (this->super_ReaderBase).ptr_;
  }
  pcVar3 = pcVar3 + 1;
  (this->super_ReaderBase).ptr_ = pcVar3;
  loc = pcVar3;
  if (0 < iVar1) {
    iVar2 = iVar1;
    do {
      if (*loc == '\0') {
        if (loc == (this->super_ReaderBase).end_) {
          local_40.types_ = 0;
          DoReportError(this,loc,(CStringRef)0x13a771,&local_40);
          loc = (this->super_ReaderBase).ptr_;
        }
      }
      else if (*loc == '\n') {
        this->line_start_ = loc + 1;
        this->line_ = this->line_ + 1;
      }
      loc = loc + 1;
      (this->super_ReaderBase).ptr_ = loc;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  if (*loc != '\n') {
    local_40.types_ = 0;
    DoReportError(this,loc,(CStringRef)0x139ed5,&local_40);
    loc = (this->super_ReaderBase).ptr_;
  }
  this->line_ = this->line_ + 1;
  if (iVar1 == 0) {
    pcVar3 = (char *)0x0;
  }
  (this->super_ReaderBase).ptr_ = loc + 1;
  this->line_start_ = loc + 1;
  SVar4.size_ = (size_t)iVar1;
  SVar4.data_ = pcVar3;
  return SVar4;
}

Assistant:

fmt::StringRef mp::internal::TextReader<Locale>::ReadString() {
  int length = ReadUInt();
  if (*ptr_ != ':')
    DoReportError(ptr_, "expected ':'");
  ++ptr_;
  const char *start = ptr_;
  for (int i = 0; i < length; ++i, ++ptr_) {
    char c = *ptr_;
    if (c == '\n') {
      line_start_ = ptr_  + 1;
      ++line_;
    } else if (!c && ptr_ == end_) {
      DoReportError(ptr_, "unexpected end of file in string");
    }
  }
  if (*ptr_ != '\n')
    DoReportError(ptr_, "expected newline");
  ++line_;
  line_start_ = ++ptr_;
  return fmt::StringRef(length != 0 ? start : 0, length);
}